

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct
          (CopyPropagateArrays *this,Instruction *conststruct_inst)

{
  uint uVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pMVar6;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  *pvVar7;
  const_reference pvVar8;
  pointer other;
  Instruction *in_RDX;
  undefined1 local_40 [8];
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  member_object;
  uint32_t i;
  AccessChainEntry last_access;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  memory_object;
  Instruction *conststruct_inst_local;
  CopyPropagateArrays *this_local;
  
  OVar3 = Instruction::opcode(in_RDX);
  if (OVar3 != OpCompositeConstruct) {
    __assert_fail("conststruct_inst->opcode() == spv::Op::OpCompositeConstruct && \"Expecting an OpCompositeConstruct instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x147,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct(Instruction *)"
                 );
  }
  Instruction::GetSingleWordInOperand(in_RDX,0);
  GetSourceObjectIfAny((CopyPropagateArrays *)&last_access.field_1,(uint32_t)conststruct_inst);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&last_access.field_1);
  if (bVar2) {
    pMVar6 = std::
             unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
             ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           *)&last_access.field_1);
    bVar2 = MemoryObject::IsMember(pMVar6);
    if (bVar2) {
      pMVar6 = std::
               unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             *)&last_access.field_1);
      pvVar7 = MemoryObject::AccessChain(pMVar6);
      pvVar8 = std::
               vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
               ::back(pvVar7);
      unique0x00012000 = *pvVar8;
      bVar2 = IsAccessChainIndexValidAndEqualTo
                        ((CopyPropagateArrays *)conststruct_inst,
                         (AccessChainEntry *)
                         ((long)&member_object._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                 ._M_head_impl + 4),0);
      if (bVar2) {
        pMVar6 = std::
                 unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                               *)&last_access.field_1);
        MemoryObject::PopIndirection(pMVar6);
        pMVar6 = std::
                 unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                               *)&last_access.field_1);
        uVar4 = MemoryObject::GetNumberOfMembers(pMVar6);
        uVar5 = Instruction::NumInOperands(in_RDX);
        if (uVar4 == uVar5) {
          for (member_object._M_t.
               super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
               _M_head_impl._0_4_ = 1;
              uVar1 = (uint)member_object._M_t.
                            super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                            .
                            super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                            ._M_head_impl, uVar4 = Instruction::NumInOperands(in_RDX), uVar1 < uVar4
              ; member_object._M_t.
                super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
                _M_head_impl._0_4_ =
                     (uint)member_object._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           .
                           super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                           ._M_head_impl + 1) {
            Instruction::GetSingleWordInOperand
                      (in_RDX,(uint)member_object._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                    .
                                    super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                    ._M_head_impl);
            GetSourceObjectIfAny((CopyPropagateArrays *)local_40,(uint32_t)conststruct_inst);
            bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_40);
            if (bVar2) {
              pMVar6 = std::
                       unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                       ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                     *)local_40);
              bVar2 = MemoryObject::IsMember(pMVar6);
              if (bVar2) {
                pMVar6 = std::
                         unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                         ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                       *)&last_access.field_1);
                other = std::
                        unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        ::get((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                               *)local_40);
                bVar2 = MemoryObject::Contains(pMVar6,other);
                if (bVar2) {
                  pMVar6 = std::
                           unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                         *)local_40);
                  pvVar7 = MemoryObject::AccessChain(pMVar6);
                  pvVar8 = std::
                           vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                           ::back(pvVar7);
                  unique0x00012000 = *pvVar8;
                  bVar2 = IsAccessChainIndexValidAndEqualTo
                                    ((CopyPropagateArrays *)conststruct_inst,
                                     (AccessChainEntry *)
                                     ((long)&member_object._M_t.
                                             super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                             .
                                             super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                             ._M_head_impl + 4),
                                     (uint)member_object._M_t.
                                           super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                           .
                                           super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                           ._M_head_impl);
                  if (bVar2) {
                    last_access.is_result_id = false;
                    last_access._1_3_ = 0;
                  }
                  else {
                    std::
                    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                    ::
                    unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                                *)this,(nullptr_t)0x0);
                    last_access.is_result_id = true;
                    last_access._1_3_ = 0;
                  }
                }
                else {
                  std::
                  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  ::
                  unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                            ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                              *)this,(nullptr_t)0x0);
                  last_access.is_result_id = true;
                  last_access._1_3_ = 0;
                }
              }
              else {
                std::
                unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                ::
                unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                          ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                            *)this,(nullptr_t)0x0);
                last_access.is_result_id = true;
                last_access._1_3_ = 0;
              }
            }
            else {
              std::
              unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
              ::
              unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                        ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                          *)this,(nullptr_t)0x0);
              last_access.is_result_id = true;
              last_access._1_3_ = 0;
            }
            std::
            unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
            ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           *)local_40);
            if (last_access._0_4_ != 0) goto LAB_0031f4cc;
          }
          std::
          unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          ::unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        *)this,(unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                *)&last_access.field_1);
          last_access.is_result_id = true;
          last_access._1_3_ = 0;
        }
        else {
          std::
          unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
          ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                    ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                      *)this,(nullptr_t)0x0);
          last_access.is_result_id = true;
          last_access._1_3_ = 0;
        }
      }
      else {
        std::
        unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
        ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                  ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                    *)this,(nullptr_t)0x0);
        last_access.is_result_id = true;
        last_access._1_3_ = 0;
      }
    }
    else {
      std::
      unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
      ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  *)this,(nullptr_t)0x0);
      last_access.is_result_id = true;
      last_access._1_3_ = 0;
    }
  }
  else {
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
    ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                *)this,(nullptr_t)0x0);
    last_access.is_result_id = true;
    last_access._1_3_ = 0;
  }
LAB_0031f4cc:
  std::
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 *)&last_access.field_1);
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct(
    Instruction* conststruct_inst) {
  assert(conststruct_inst->opcode() == spv::Op::OpCompositeConstruct &&
         "Expecting an OpCompositeConstruct instruction.");

  // If every operand in the instruction are part of the same memory object, and
  // are being combined in the same order, then the result is the same as the
  // parent.

  std::unique_ptr<MemoryObject> memory_object =
      GetSourceObjectIfAny(conststruct_inst->GetSingleWordInOperand(0));

  if (!memory_object) {
    return nullptr;
  }

  if (!memory_object->IsMember()) {
    return nullptr;
  }

  AccessChainEntry last_access = memory_object->AccessChain().back();
  if (!IsAccessChainIndexValidAndEqualTo(last_access, 0)) {
    return nullptr;
  }

  memory_object->PopIndirection();
  if (memory_object->GetNumberOfMembers() !=
      conststruct_inst->NumInOperands()) {
    return nullptr;
  }

  for (uint32_t i = 1; i < conststruct_inst->NumInOperands(); ++i) {
    std::unique_ptr<MemoryObject> member_object =
        GetSourceObjectIfAny(conststruct_inst->GetSingleWordInOperand(i));

    if (!member_object) {
      return nullptr;
    }

    if (!member_object->IsMember()) {
      return nullptr;
    }

    if (!memory_object->Contains(member_object.get())) {
      return nullptr;
    }

    last_access = member_object->AccessChain().back();
    if (!IsAccessChainIndexValidAndEqualTo(last_access, i)) {
      return nullptr;
    }
  }
  return memory_object;
}